

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocate.cpp
# Opt level: O0

void Relocation::refreshMaxTableCount(void)

{
  ulong uVar1;
  size_type sVar2;
  
  uVar1 = maxTableCount;
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)offsets);
  if (uVar1 < sVar2) {
    maxTableCount =
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                   ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)offsets);
  }
  if ((type != 0) || (maxTableCount != 0)) {
    isResultAffected = 0;
    deltaType = 0;
    CLabelTable::Insert(&LabelTable,"relocate_count",(aint)maxTableCount,2,-1);
    CLabelTable::Insert(&LabelTable,"relocate_size",(aint)(maxTableCount << 1),2,-1);
  }
  return;
}

Assistant:

static void Relocation::refreshMaxTableCount() {
	if (maxTableCount < offsets.size()) {
		maxTableCount = offsets.size();
	}
	// add the relocate_count and relocate_size symbols only when RELOCATE feature was used
	if (type || maxTableCount) {
		isResultAffected = false;
		deltaType = OFF;
		LabelTable.Insert("relocate_count", maxTableCount, LABEL_IS_DEFL);
		LabelTable.Insert("relocate_size", maxTableCount * 2, LABEL_IS_DEFL);
	}
}